

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::compute::anon_unknown_0::SharedVarTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SharedVarTestInstance *this)

{
  ProgramCollection<vk::ProgramBinary> *this_00;
  int iVar1;
  deUint32 queueFamilyIndex;
  uint uVar2;
  int iVar3;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_01;
  DescriptorPoolBuilder *this_02;
  DescriptorSetUpdateBuilder *this_03;
  ProgramBinary *binary;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  VkDeviceSize bufferSize;
  int iVar11;
  RefBase<vk::VkCommandBuffer_s_*> local_368;
  ulong local_348;
  VkQueue local_340;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_338;
  VkBufferMemoryBarrier computeFinishBarrier;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_2d8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_2b8;
  VkDescriptorBufferInfo descriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_278;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_258;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_238;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_218;
  string local_1f8;
  Buffer buffer;
  ostringstream msg;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_340 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  uVar2 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_localSize);
  iVar3 = compute::(anonymous_namespace)::multiplyComponents<int,3>(&this->m_workSize);
  bufferSize = (long)iVar3 * (long)(int)uVar2 * 4;
  local_348 = (ulong)uVar2;
  makeBufferCreateInfo((VkBufferCreateInfo *)&msg,bufferSize,0x20);
  compute::Buffer::Buffer
            (&buffer,vk,device,allocator,(VkBufferCreateInfo *)&msg,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&msg);
  this_01 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&msg,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&computeFinishBarrier,this_01,vk,device,0);
  local_2b8.m_data.deleter.m_device = (VkDevice)computeFinishBarrier._16_8_;
  local_2b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)computeFinishBarrier._24_8_;
  local_2b8.m_data.object.m_internal = computeFinishBarrier._0_8_;
  local_2b8.m_data.deleter.m_deviceIface = (DeviceInterface *)computeFinishBarrier.pNext;
  computeFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  computeFinishBarrier._4_4_ = 0;
  computeFinishBarrier.pNext = (void *)0x0;
  computeFinishBarrier.srcAccessMask = 0;
  computeFinishBarrier.dstAccessMask = 0;
  computeFinishBarrier.srcQueueFamilyIndex = 0;
  computeFinishBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&computeFinishBarrier);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&msg);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&computeFinishBarrier)
  ;
  this_02 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&computeFinishBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&msg,this_02,vk,device,1,1);
  local_218.m_data.object.m_internal = (deUint64)_msg;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&msg);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&computeFinishBarrier);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&msg,vk,device,
                    (VkDescriptorPool)local_218.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_2b8.m_data.object.m_internal);
  local_2d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2d8.m_data.deleter.m_pool.m_internal = 0;
  local_2d8.m_data.object.m_internal = (deUint64)_msg;
  local_2d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&msg);
  descriptorInfo.buffer.m_internal =
       buffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorInfo.offset = 0;
  descriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&msg);
  computeFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  computeFinishBarrier._4_4_ = 0;
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&msg,
                       (VkDescriptorSet)local_2d8.m_data.object.m_internal,
                       (Location *)&computeFinishBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &descriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&msg);
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&computeFinishBarrier,"comp",(allocator<char> *)&local_338);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&computeFinishBarrier);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&msg,vk,device,binary,0);
  local_238.m_data.deleter.m_device = (VkDevice)0x0;
  local_238.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_238.m_data.object.m_internal = (deUint64)_msg;
  local_238.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&msg);
  std::__cxx11::string::~string((string *)&computeFinishBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&msg,vk,device,
                     (VkDescriptorSetLayout)local_2b8.m_data.object.m_internal);
  local_338.m_data.deleter.m_device = (VkDevice)0x0;
  local_338.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_338.m_data.object.m_internal = (deUint64)_msg;
  local_338.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&msg);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&msg,vk,device,
                      (VkPipelineLayout)local_338.m_data.object.m_internal,
                      (VkShaderModule)local_238.m_data.object.m_internal);
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_258.m_data.object.m_internal = (deUint64)_msg;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&msg);
  makeBufferMemoryBarrier
            (&computeFinishBarrier,0x40,0x2000,
             (VkBuffer)
             buffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&msg,vk,device,queueFamilyIndex);
  local_278.m_data.deleter.m_device = (VkDevice)0x0;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_278.m_data.object.m_internal = (deUint64)_msg;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&msg);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&msg,vk,device,
             (VkCommandPool)local_278.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_368.m_data.deleter.m_device = (VkDevice)0x0;
  local_368.m_data.deleter.m_pool.m_internal = 0;
  local_368.m_data.object = (VkCommandBuffer_s *)_msg;
  local_368.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  _msg = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&msg);
  beginCommandBuffer(vk,local_368.m_data.object);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_368.m_data.object,1,local_258.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_368.m_data.object,1,local_338.m_data.object.m_internal,0,1,&local_2d8,0,0);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_368.m_data.object,(ulong)(uint)(this->m_workSize).m_data[0],
             (ulong)(uint)(this->m_workSize).m_data[1]);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_368.m_data.object,0x800,0x4000,0,0,0,1,&computeFinishBarrier,0,0);
  endCommandBuffer(vk,local_368.m_data.object);
  submitCommandsAndWait(vk,device,local_340,local_368.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((buffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (buffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  lVar5 = 0;
  iVar10 = (int)local_348;
  uVar6 = 0;
  if (0 < iVar10) {
    uVar6 = local_348 & 0xffffffff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar11 = 1;
  iVar8 = 0;
  do {
    if (iVar8 == iVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"Compute succeeded",(allocator<char> *)&local_1f8);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
LAB_006a683d:
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_368);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_278);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_258);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_338);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_238);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_2d8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_218);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_2b8);
      compute::Buffer::~Buffer(&buffer);
      return __return_storage_ptr__;
    }
    uVar7 = 0;
    iVar9 = iVar10;
    while (iVar9 = iVar9 + -1, uVar6 != uVar7) {
      iVar1 = (int)uVar7;
      uVar7 = uVar7 + 1;
      if (*(int *)((long)(buffer.m_allocation.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_hostPtr + (long)((int)lVar5 + iVar1) * 4) !=
          iVar9 * iVar9 + iVar8 * iVar10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar4 = std::operator<<((ostream *)&msg,"Comparison failed for Output.values[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar7 - iVar11);
        std::operator<<(poVar4,"]");
        std::__cxx11::stringbuf::str();
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
        goto LAB_006a683d;
      }
    }
    iVar8 = iVar8 + 1;
    iVar11 = iVar11 - iVar10;
    lVar5 = lVar5 + (local_348 & 0xffffffff);
  } while( true );
}

Assistant:

tcu::TestStatus SharedVarTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const int workGroupSize = multiplyComponents(m_localSize);
	const int workGroupCount = multiplyComponents(m_workSize);

	// Create a buffer and host-visible memory for it

	const VkDeviceSize bufferSizeBytes = sizeof(deUint32) * workGroupSize * workGroupCount;
	const Buffer buffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo descriptorInfo = makeDescriptorBufferInfo(*buffer, 0ull, bufferSizeBytes);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo)
		.update(vk, device);

	// Perform the computation

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const VkBufferMemoryBarrier computeFinishBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *buffer, 0ull, bufferSizeBytes);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, m_workSize.x(), m_workSize.y(), m_workSize.z());

	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &computeFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

	endCommandBuffer(vk, *cmdBuffer);

	// Wait for completion

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Validate the results

	const Allocation& bufferAllocation = buffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(bufferAllocation.getHostPtr());

	for (int groupNdx = 0; groupNdx < workGroupCount; ++groupNdx)
	{
		const int globalOffset = groupNdx * workGroupSize;
		for (int localOffset = 0; localOffset < workGroupSize; ++localOffset)
		{
			const deUint32 res = bufferPtr[globalOffset + localOffset];
			const deUint32 ref = globalOffset + squared(workGroupSize - localOffset - 1);

			if (res != ref)
			{
				std::ostringstream msg;
				msg << "Comparison failed for Output.values[" << (globalOffset + localOffset) << "]";
				return tcu::TestStatus::fail(msg.str());
			}
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}